

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O2

fiobj_type_enum fiobj_type(FIOBJ o)

{
  fiobj_type_enum fVar1;
  
  if (o != 0) {
    fVar1 = FIOBJ_T_NUMBER;
    if ((o & 1) == 0) {
      switch((uint)o & 6) {
      case 0:
        fVar1 = *(fiobj_type_enum *)(o & 0xfffffffffffffff8);
        break;
      case 2:
        return FIOBJ_T_STRING;
      case 4:
        return FIOBJ_T_HASH;
      case 6:
        return (fiobj_type_enum)o;
      }
    }
    return fVar1;
  }
  return FIOBJ_T_NULL;
}

Assistant:

FIO_INLINE fiobj_type_enum fiobj_type(FIOBJ o) {
  if (!o)
    return FIOBJ_T_NULL;
  if (o & FIOBJECT_NUMBER_FLAG)
    return FIOBJ_T_NUMBER;
  if ((o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_PRIMITIVE_FLAG)
    return (fiobj_type_enum)o;
  if (FIOBJECT_STRING_FLAG &&
      (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_STRING_FLAG)
    return FIOBJ_T_STRING;
  if (FIOBJECT_HASH_FLAG && (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_HASH_FLAG)
    return FIOBJ_T_HASH;
  return ((fiobj_type_enum *)FIOBJ2PTR(o))[0];
}